

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

float ImGui::CalcItemWidth(void)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *window;
  float *pfVar2;
  float fVar3;
  float fVar4;
  
  pIVar1 = GImGui->CurrentWindow;
  pfVar2 = &(GImGui->NextItemData).Width;
  if (((GImGui->NextItemData).Flags & 1) == 0) {
    pfVar2 = &(pIVar1->DC).ItemWidth;
  }
  fVar4 = *pfVar2;
  if (fVar4 < 0.0) {
    fVar3 = (pIVar1->ContentRegionRect).Max.x;
    if ((pIVar1->DC).CurrentColumns != (ImGuiColumns *)0x0) {
      fVar3 = (pIVar1->WorkRect).Max.x;
    }
    fVar3 = fVar4 + (fVar3 - (pIVar1->DC).CursorPos.x);
    fVar4 = 1.0;
    if (1.0 <= fVar3) {
      fVar4 = fVar3;
    }
  }
  return (float)(int)fVar4;
}

Assistant:

float ImGui::CalcItemWidth()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float w;
    if (g.NextItemData.Flags & ImGuiNextItemDataFlags_HasWidth)
        w = g.NextItemData.Width;
    else
        w = window->DC.ItemWidth;
    if (w < 0.0f)
    {
        float region_max_x = GetContentRegionMaxAbs().x;
        w = ImMax(1.0f, region_max_x - window->DC.CursorPos.x + w);
    }
    w = IM_FLOOR(w);
    return w;
}